

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O2

Ray * __thiscall phyr::Transform::operator()(Ray *__return_storage_ptr__,Transform *this,Ray *r)

{
  double dVar1;
  double dVar2;
  Vector3f roError;
  Vector3f d;
  Point3<double> local_78;
  Vector3<double> local_58;
  double local_38;
  double dStack_30;
  double local_28;
  
  local_58.x = 0.0;
  local_58.y = 0.0;
  local_58.z = 0.0;
  operator()(&local_78,this,&r->o,&local_58);
  operator()(this,&r->d);
  dVar1 = r->tMax;
  dVar2 = local_28 * local_28 + local_38 * local_38 + dStack_30 * dStack_30;
  if (0.0 < dVar2) {
    dVar2 = (ABS(local_28) * local_58.z + ABS(local_38) * local_58.x + ABS(dStack_30) * local_58.y)
            / dVar2;
    dVar1 = dVar1 - dVar2;
    local_78.x = dVar2 * local_38 + local_78.x;
    local_78.y = dVar2 * dStack_30 + local_78.y;
    local_78.z = local_28 * dVar2 + local_78.z;
  }
  (__return_storage_ptr__->o).z = local_78.z;
  (__return_storage_ptr__->o).x = local_78.x;
  (__return_storage_ptr__->o).y = local_78.y;
  (__return_storage_ptr__->d).x = local_38;
  (__return_storage_ptr__->d).y = dStack_30;
  (__return_storage_ptr__->d).z = local_28;
  __return_storage_ptr__->tMax = dVar1;
  return __return_storage_ptr__;
}

Assistant:

inline Ray Transform::operator()(const Ray& r) const {
    Vector3f roError;

    // Transform ray origin and direction
    Point3f o = (*this)(r.o, &roError);
    Vector3f d = (*this)(r.d);

    Real tMax = r.tMax, lengthSq = d.lengthSquared();
    if (lengthSq > 0) {
        Real factor = dot(abs(d), roError) / lengthSq;
        o += d * factor; tMax -= factor;
    }

    return Ray(o, d, tMax);
}